

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O2

CodeLocation __thiscall
soul::SourceCodeUtilities::findNextOccurrence
          (SourceCodeUtilities *this,CodeLocation *start,char character)

{
  UnicodeChar UVar1;
  UTF8Reader extraout_RDX;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  CodeLocation CVar6;
  RefCountedPtr<soul::SourceCodeText> local_28;
  UTF8Reader UStack_20;
  
  local_28.object = (start->sourceCode).object;
  if (local_28.object != (SourceCodeText *)0x0) {
    ((local_28.object)->super_RefCountedObject).refCount =
         ((local_28.object)->super_RefCountedObject).refCount + 1;
  }
  UStack_20.data = (start->location).data;
  do {
    UVar1 = UTF8Reader::operator*(&UStack_20);
    if (UVar1 == (int)character) {
      uVar2 = local_28.object._0_4_;
      uVar3 = local_28.object._4_4_;
      local_28.object = (SourceCodeText *)0x0;
      uVar4 = UStack_20.data._0_4_;
      uVar5 = UStack_20.data._4_4_;
LAB_001eb878:
      *(undefined4 *)this = uVar2;
      *(undefined4 *)(this + 4) = uVar3;
      *(undefined4 *)(this + 8) = uVar4;
      *(undefined4 *)(this + 0xc) = uVar5;
      RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_28);
      CVar6.location.data = extraout_RDX.data;
      CVar6.sourceCode.object = (SourceCodeText *)this;
      return CVar6;
    }
    if (UVar1 == 0) {
      uVar2 = 0;
      uVar3 = 0;
      uVar4 = 0;
      uVar5 = 0;
      goto LAB_001eb878;
    }
    UTF8Reader::operator++(&UStack_20);
  } while( true );
}

Assistant:

CodeLocation SourceCodeUtilities::findNextOccurrence (CodeLocation start, char character)
{
    for (auto pos = start;; ++(pos.location))
    {
        auto c = *(pos.location);

        if (c == static_cast<decltype(c)> (character))
            return pos;

        if (c == 0)
            return {};
    }
}